

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O1

string * __thiscall
choc::html::HTMLElement::escapeHTMLString_abi_cxx11_
          (string *__return_storage_ptr__,HTMLElement *this,string_view text,bool escapeNewLines)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  long *plVar5;
  uint32_t uVar6;
  long *plVar7;
  uint32_t c;
  byte *pbVar8;
  byte *pbVar9;
  long *local_98;
  ulong local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long *local_50;
  uint local_48;
  long local_40 [2];
  
  pbVar8 = (byte *)text._M_len;
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (HTMLElement *)0x0) {
    pbVar9 = pbVar8 + (long)&this->name;
    do {
      bVar1 = *pbVar8;
      c = (uint32_t)(char)bVar1;
      bVar3 = isCharLegal(c);
      if (bVar3) {
LAB_002721f5:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        if (bVar1 < 0x3c) {
          if ((bVar1 != 0x22) && (bVar1 != 0x26)) {
LAB_0027223f:
            if (((char)text._M_str == '\0') && ((bVar1 == 0xd || (bVar1 == 10)))) goto LAB_002721f5;
            cVar4 = '\x01';
            if (9 < bVar1) {
              uVar6 = c;
              cVar2 = '\x04';
              do {
                cVar4 = cVar2;
                if (uVar6 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_002722be;
                }
                if (uVar6 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_002722be;
                }
                if (uVar6 < 10000) goto LAB_002722be;
                bVar3 = 99999 < uVar6;
                uVar6 = uVar6 / 10000;
                cVar2 = cVar4 + '\x04';
              } while (bVar3);
              cVar4 = cVar4 + '\x01';
            }
LAB_002722be:
            local_50 = local_40;
            std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,c);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2afa3e);
            local_98 = &local_88;
            plVar7 = plVar5 + 2;
            if ((long *)*plVar5 == plVar7) {
              local_88 = *plVar7;
              lStack_80 = plVar5[3];
            }
            else {
              local_88 = *plVar7;
              local_98 = (long *)*plVar5;
            }
            local_90 = plVar5[1];
            *plVar5 = (long)plVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_98,local_90,0,'\x01');
            local_78 = &local_68;
            plVar7 = plVar5 + 2;
            if ((long *)*plVar5 == plVar7) {
              local_68 = *plVar7;
              lStack_60 = plVar5[3];
            }
            else {
              local_68 = *plVar7;
              local_78 = (long *)*plVar5;
            }
            local_70 = plVar5[1];
            *plVar5 = (long)plVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
            if (local_78 != &local_68) {
              operator_delete(local_78,local_68 + 1);
            }
            if (local_98 != &local_88) {
              operator_delete(local_98,local_88 + 1);
            }
            if (local_50 != local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
            goto LAB_002722a6;
          }
        }
        else if ((bVar1 != 0x3c) && (bVar1 != 0x3e)) goto LAB_0027223f;
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
LAB_002722a6:
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string escapeHTMLString (std::string_view text, bool escapeNewLines)
    {
        std::string result;

        for (auto character : text)
        {
            auto unicodeChar = static_cast<uint32_t> (character);

            if (isCharLegal (unicodeChar))
            {
                result += character;
            }
            else
            {
                switch (unicodeChar)
                {
                    case '<':   result += "&lt;";   break;
                    case '>':   result += "&gt;";   break;
                    case '&':   result += "&amp;";  break;
                    case '"':   result += "&quot;"; break;

                    default:
                        if (! escapeNewLines && (unicodeChar == '\n' || unicodeChar == '\r'))
                            result += character;
                        else
                            result += "&#" + std::to_string (unicodeChar) + ';';

                        break;
                }
            }
        }

        return result;
    }